

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O3

sunrealtype * N_VGetSubvectorArrayPointer_ManyVector(N_Vector v,sunindextype vec_num)

{
  sunrealtype *psVar1;
  
  if (*(long *)(*(long *)(*(long *)(*(long *)((long)v->content + 0x10) + vec_num * 8) + 8) + 0x28)
      == 0) {
    return (sunrealtype *)0x0;
  }
  psVar1 = (sunrealtype *)N_VGetArrayPointer();
  return psVar1;
}

Assistant:

sunrealtype* MVAPPEND(N_VGetSubvectorArrayPointer)(N_Vector v,
                                                   sunindextype vec_num)
{
  SUNFunctionBegin(v->sunctx);
  SUNAssertNull(vec_num >= 0, SUN_ERR_ARG_OUTOFRANGE);
  SUNAssertNull(vec_num < MANYVECTOR_NUM_SUBVECS(v), SUN_ERR_ARG_OUTOFRANGE);
  sunrealtype* arr = NULL;
  if (MANYVECTOR_SUBVEC(v, vec_num)->ops->nvgetarraypointer)
  {
    arr = N_VGetArrayPointer(MANYVECTOR_SUBVEC(v, vec_num));
    SUNCheckLastErrNull();
  }
  return arr;
}